

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<UncompressedRow>::reallocateAndGrow
          (QArrayDataPointer<UncompressedRow> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<UncompressedRow> *old)

{
  QArrayData *pQVar1;
  UncompressedRow *pUVar2;
  qsizetype qVar3;
  const_iterator piVar4;
  const_iterator piVar5;
  int iVar6;
  undefined4 uVar7;
  UncompressedRow *data;
  long lVar8;
  UncompressedRow *pUVar9;
  UncompressedRow *pUVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  QArrayDataPointer<UncompressedRow> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<UncompressedRow> *)0x0 && where == GrowsAtEnd) &&
       (pQVar1 = &this->d->super_QArrayData, pQVar1 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar11 = QArrayData::reallocateUnaligned
                        (pQVar1,this->ptr,0x28,
                         n + this->size +
                         ((long)((long)this->ptr -
                                ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
                         -0x3333333333333333,Grow);
    this->d = (Data *)auVar11._0_8_;
    this->ptr = (UncompressedRow *)auVar11._8_8_;
  }
  else {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (UncompressedRow *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_38,this,n,where);
    if (this->size != 0) {
      lVar8 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<UncompressedRow> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        if (0 < lVar8) {
          pUVar9 = this->ptr;
          pUVar2 = pUVar9 + lVar8;
          pUVar10 = local_38.ptr + local_38.size;
          do {
            pUVar10->_M_endNonZeros = pUVar9->_M_endNonZeros;
            iVar6 = pUVar9->_M_index;
            uVar7 = *(undefined4 *)&pUVar9->field_0x4;
            piVar4 = pUVar9->_M_begin;
            piVar5 = pUVar9->_M_beginNonZeros;
            pUVar10->_M_end = pUVar9->_M_end;
            pUVar10->_M_beginNonZeros = piVar5;
            pUVar10->_M_index = iVar6;
            *(undefined4 *)&pUVar10->field_0x4 = uVar7;
            pUVar10->_M_begin = piVar4;
            pUVar9 = pUVar9 + 1;
            local_38.size = local_38.size + 1;
            pUVar10 = pUVar10 + 1;
          } while (pUVar9 < pUVar2);
        }
      }
      else if (0 < lVar8) {
        pUVar9 = this->ptr;
        pUVar2 = pUVar9 + lVar8;
        pUVar10 = local_38.ptr + local_38.size;
        do {
          pUVar10->_M_endNonZeros = pUVar9->_M_endNonZeros;
          iVar6 = pUVar9->_M_index;
          uVar7 = *(undefined4 *)&pUVar9->field_0x4;
          piVar4 = pUVar9->_M_begin;
          piVar5 = pUVar9->_M_beginNonZeros;
          pUVar10->_M_end = pUVar9->_M_end;
          pUVar10->_M_beginNonZeros = piVar5;
          pUVar10->_M_index = iVar6;
          *(undefined4 *)&pUVar10->field_0x4 = uVar7;
          pUVar10->_M_begin = piVar4;
          pUVar9 = pUVar9 + 1;
          local_38.size = local_38.size + 1;
          pUVar10 = pUVar10 + 1;
        } while (pUVar9 < pUVar2);
      }
    }
    pQVar1 = &this->d->super_QArrayData;
    this->d = local_38.d;
    pUVar2 = this->ptr;
    this->ptr = local_38.ptr;
    qVar3 = this->size;
    this->size = local_38.size;
    local_38.d = (Data *)pQVar1;
    local_38.ptr = pUVar2;
    local_38.size = qVar3;
    if (old != (QArrayDataPointer<UncompressedRow> *)0x0) {
      local_38.d = old->d;
      old->d = (Data *)pQVar1;
      local_38.ptr = old->ptr;
      old->ptr = pUVar2;
      local_38.size = old->size;
      old->size = qVar3;
    }
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x28,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }